

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

bool anon_unknown.dwarf_90803::isIdStart(QChar c)

{
  long lVar1;
  bool bVar2;
  Category CVar3;
  undefined2 in_DI;
  long in_FS_OFFSET;
  bool result;
  undefined4 in_stack_ffffffffffffffe8;
  uint3 in_stack_fffffffffffffff0;
  uint uVar4;
  QChar in_stack_fffffffffffffff4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (uint)in_stack_fffffffffffffff0;
  CVar3 = QChar::category((QChar *)0x142e99);
  if ((CVar3 == Number_Letter) || (CVar3 - Letter_Uppercase < 5)) {
    bVar2 = true;
  }
  else {
    QChar::QChar<char16_t,_true>((QChar *)&stack0xfffffffffffffff4,L'_');
    bVar2 = ::operator==((QChar *)CONCAT26(in_DI,CONCAT24(in_stack_fffffffffffffff4.ucs,uVar4)),
                         (QChar *)CONCAT44(CVar3,in_stack_ffffffffffffffe8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

static bool isIdStart(QChar c)
    {
        bool result = false;
        switch (c.category()) {
        case QChar::Letter_Uppercase:
        case QChar::Letter_Lowercase:
        case QChar::Letter_Titlecase:
        case QChar::Letter_Modifier:
        case QChar::Letter_Other:
        case QChar::Number_Letter:
            result = true;
            break;
        default:
            result = c == u'_';
            break;
        }
        return result;
    }